

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

void __thiscall SQVM::CallErrorHandler(SQVM *this,SQObjectPtr *error)

{
  SQObjectPtr out;
  SQObjectPtr local_20;
  
  if ((this->_errorhandler).super_SQObject._type != OT_NULL) {
    local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_20.super_SQObject._type = OT_NULL;
    Push(this,&this->_roottable);
    Push(this,error);
    Call(this,&this->_errorhandler,2,this->_top + -2,&local_20,0);
    Pop(this,2);
    SQObjectPtr::~SQObjectPtr(&local_20);
  }
  return;
}

Assistant:

void SQVM::CallErrorHandler(SQObjectPtr &error)
{
    if(sq_type(_errorhandler) != OT_NULL) {
        SQObjectPtr out;
        Push(_roottable); Push(error);
        Call(_errorhandler, 2, _top-2, out,SQFalse);
        Pop(2);
    }
}